

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O3

bool __thiscall Potassco::TheoryTerm::isTuple(TheoryTerm *this)

{
  ulong uVar1;
  
  uVar1 = this->data_;
  if (uVar1 == 0xffffffffffffffff) {
    fail(-2,"Theory_t Potassco::TheoryTerm::type() const",0x4d,"valid()","Invalid term",0,
         0xffffffffffffffff);
  }
  if (((uint)uVar1 & 3) == 2) {
    return SUB41((uint)*(undefined4 *)(uVar1 & 0xfffffffffffffffc) >> 0x1f,0);
  }
  return false;
}

Assistant:

Theory_t TheoryTerm::type() const { POTASSCO_REQUIRE(valid(), "Invalid term"); return static_cast<Theory_t>(data_&typeMask); }